

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
                *generators,bool is_end)

{
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  in_RSI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff48;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff50;
  ParamGenerator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff58;
  ParamIterator<libaom_test::TestMode> *in_stack_ffffffffffffff60;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff68;
  _Head_base<2UL,_testing::internal::ParamIterator<int>,_false> *__elements;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>
  *in_stack_ffffffffffffff80;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::ParamIteratorInterface
            ((ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
              *)in_RDI);
  (in_RDI->
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  ).
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
  super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl =
       (ParamIterator<int>)&PTR__IteratorImpl_01f6db48;
  (in_RDI->
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  ).
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<3UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false> =
       in_RSI.
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
       _M_head_impl;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a58c1);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin(in_stack_ffffffffffffff58);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a58e0);
  ParamGenerator<libaom_test::TestMode>::begin
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff58);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a58fc);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff58);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a5918);
  ParamGenerator<unsigned_int>::begin((ParamGenerator<unsigned_int> *)in_stack_ffffffffffffff58);
  std::
  get<4ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a5934);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff58);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_true,_true>
            (in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (ParamIterator<int> *)in_stack_ffffffffffffff58,
             (ParamIterator<unsigned_int> *)in_stack_ffffffffffffff50,
             (ParamIterator<int> *)in_stack_ffffffffffffff48);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x7a5975);
  ParamIterator<unsigned_int>::~ParamIterator((ParamIterator<unsigned_int> *)0x7a597f);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x7a5989);
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x7a5993);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x7a59a0);
  __elements = &in_RDI[1].
                super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                .
                super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                .
                super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a59bb);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end(in_stack_ffffffffffffff58);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a59d7);
  ParamGenerator<libaom_test::TestMode>::end
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff58);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a59f3);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff58);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a5a0f);
  ParamGenerator<unsigned_int>::end((ParamGenerator<unsigned_int> *)in_stack_ffffffffffffff58);
  std::
  get<4ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
              *)0x7a5a2b);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff58);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_true,_true>
            (in_RDI,(ParamIterator<const_libaom_test::CodecFactory_*> *)__elements,
             in_stack_ffffffffffffff60,(ParamIterator<int> *)in_stack_ffffffffffffff58,
             (ParamIterator<unsigned_int> *)in_stack_ffffffffffffff50,
             (ParamIterator<int> *)in_stack_ffffffffffffff48);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x7a5a69);
  ParamIterator<unsigned_int>::~ParamIterator((ParamIterator<unsigned_int> *)0x7a5a73);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x7a5a7d);
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x7a5a87);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x7a5a91);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
  ::tuple(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
                *)0x7a5aee);
  ComputeCurrentValue(in_stack_ffffffffffffff80);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }